

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O1

Frc_Man_t * Frc_ManStart(Gia_Man_t *pGia)

{
  Frc_Obj_t *pObj;
  uint uVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  Frc_Man_t *pFVar5;
  Vec_Int_t *p;
  int *piVar6;
  Vec_Int_t *p_00;
  uint *puVar7;
  Vec_Int_t *pVVar8;
  Vec_Int_t *pVVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  int nFanios;
  int nObjs;
  int local_48;
  uint local_44;
  Vec_Int_t *local_40;
  ulong local_38;
  
  Frc_ManCreateRefsSpecial(pGia);
  Frc_ManTransformRefs(pGia,(int *)&local_44,&local_48);
  Gia_ManFillValue(pGia);
  pFVar5 = (Frc_Man_t *)calloc(1,0x38);
  pFVar5->pGia = pGia;
  pFVar5->nRegs = pGia->nRegs;
  iVar15 = pGia->vCis->nSize;
  p = (Vec_Int_t *)malloc(0x10);
  if (iVar15 - 1U < 0xf) {
    iVar15 = 0x10;
  }
  p->nSize = 0;
  p->nCap = iVar15;
  if (iVar15 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar15 << 2);
  }
  p->pArray = piVar6;
  pFVar5->vCis = p;
  iVar15 = pGia->vCos->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar12 = 0x10;
  if (0xe < iVar15 - 1U) {
    iVar12 = iVar15;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar12;
  if (iVar12 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar12 << 2);
  }
  p_00->pArray = piVar6;
  pFVar5->vCos = p_00;
  local_38 = (ulong)local_44;
  uVar2 = local_44 * 6 + local_48 * 2;
  pFVar5->nObjData = uVar2;
  puVar7 = (uint *)calloc((long)(int)uVar2,4);
  pFVar5->pObjData = (int *)puVar7;
  pGia->pObjs->Value = 0;
  puVar7[3] = 0;
  *puVar7 = *puVar7 & 0xf;
  if (pGia->nObjs < 1) {
LAB_00735d18:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar13 = *pGia->pRefs;
  puVar7[1] = uVar13;
  pFVar5->nObjs = pFVar5->nObjs + 1;
  uVar13 = uVar13 + 6;
  pVVar8 = pGia->vCis;
  if (0 < pVVar8->nSize) {
    lVar16 = 0;
    do {
      iVar15 = pVVar8->pArray[lVar16];
      if (((long)iVar15 < 0) || (pGia->nObjs <= iVar15)) goto LAB_00735cf9;
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = pGia->pObjs + iVar15;
      pGVar4->Value = uVar13;
      Vec_IntPush(p,uVar13);
      puVar7[(long)(int)uVar13 + 3] = uVar13;
      uVar11 = puVar7[(int)uVar13];
      puVar7[(int)uVar13] = uVar11 & 0xf;
      pGVar3 = pGia->pObjs;
      if ((pGVar4 < pGVar3) || (pGVar3 + pGia->nObjs <= pGVar4)) goto LAB_00735d18;
      uVar1 = pGia->pRefs[(int)((ulong)((long)pGVar4 - (long)pGVar3) >> 2) * -0x55555555];
      puVar7[(long)(int)uVar13 + 1] = uVar1;
      puVar7[(int)uVar13] = uVar11 & 0xf | 1;
      uVar13 = uVar13 + uVar1 + 6;
      pFVar5->nObjs = pFVar5->nObjs + 1;
      lVar16 = lVar16 + 1;
      pVVar8 = pGia->vCis;
    } while (lVar16 < pVVar8->nSize);
  }
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 100;
  pVVar8->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar8->pArray = piVar6;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 100;
  pVVar9->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar9->pArray = piVar6;
  uVar10 = (ulong)(uint)pGia->nObjs;
  iVar15 = 1;
  local_40 = pVVar9;
  if (0 < pGia->nObjs) {
    lVar16 = 0;
    do {
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = pGia->pObjs + lVar16;
      uVar11 = (uint)*(undefined8 *)pGVar4;
      if ((~uVar11 & 0x1fffffff) != 0 && -1 < (int)uVar11) {
        if ((uVar11 >> 0x1e & 1) == 0) {
          if ((int)uVar10 <= lVar16) goto LAB_00735d18;
          if (pGia->pRefs[lVar16] != 0) {
            __assert_fail("Gia_ObjRefNum( pGia, pObj ) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                          ,0x1e1,"Frc_Man_t *Frc_ManStart(Gia_Man_t *)");
          }
        }
        else {
          if ((int)uVar10 <= lVar16) goto LAB_00735d18;
          if (pGia->pRefs[lVar16] < 1) {
            __assert_fail("Gia_ObjRefNum( pGia, pObj ) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                          ,0x1e4,"Frc_Man_t *Frc_ManStart(Gia_Man_t *)");
          }
          Frc_ManCollectSuper(pGia,pGVar4,pVVar8,local_40);
          pGVar4->Value = uVar13;
          puVar7[(long)(int)uVar13 + 3] = uVar13;
          puVar7[(int)uVar13] = puVar7[(int)uVar13] & 0xf | pVVar8->nSize << 4;
          pGVar3 = pGia->pObjs;
          if ((pGVar4 < pGVar3) || (pGVar3 + pGia->nObjs <= pGVar4)) goto LAB_00735d18;
          pObj = (Frc_Obj_t *)(puVar7 + (int)uVar13);
          pObj->nFanouts =
               pGia->pRefs[(int)((ulong)((long)pGVar4 - (long)pGVar3) >> 2) * -0x55555555];
          if (0 < pVVar8->nSize) {
            lVar14 = 0;
            do {
              iVar12 = pVVar8->pArray[lVar14];
              if (((long)iVar12 < 0) || (pGia->nObjs <= iVar12)) goto LAB_00735cf9;
              if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
              Frc_ObjAddFanin(pObj,(Frc_Obj_t *)(puVar7 + (int)pGia->pObjs[iVar12].Value));
              lVar14 = lVar14 + 1;
            } while (lVar14 < pVVar8->nSize);
          }
          uVar13 = uVar13 + (*(uint *)pObj >> 4) + pObj->nFanouts + 6;
          iVar15 = iVar15 + 1;
          pFVar5->nObjs = pFVar5->nObjs + 1;
        }
      }
      lVar16 = lVar16 + 1;
      uVar10 = (ulong)pGia->nObjs;
    } while (lVar16 < (long)uVar10);
  }
  if (pVVar8->pArray != (int *)0x0) {
    free(pVVar8->pArray);
    pVVar8->pArray = (int *)0x0;
  }
  free(pVVar8);
  pVVar8 = local_40;
  if (local_40->pArray != (int *)0x0) {
    free(local_40->pArray);
    pVVar8->pArray = (int *)0x0;
  }
  free(pVVar8);
  pVVar8 = pGia->vCos;
  if (0 < pVVar8->nSize) {
    lVar16 = 0;
    do {
      iVar12 = pVVar8->pArray[lVar16];
      if (((long)iVar12 < 0) || (pGia->nObjs <= iVar12)) {
LAB_00735cf9:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = pGia->pObjs + iVar12;
      pGVar4->Value = uVar13;
      Vec_IntPush(p_00,uVar13);
      puVar7[(long)(int)uVar13 + 3] = uVar13;
      uVar11 = puVar7[(int)uVar13];
      puVar7[(long)(int)uVar13 + 1] = 0;
      puVar7[(int)uVar13] = uVar11 & 0x1f | 0x12;
      Frc_ObjAddFanin((Frc_Obj_t *)(puVar7 + (int)uVar13),
                      (Frc_Obj_t *)
                      (puVar7 + (int)pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].
                                     Value));
      uVar13 = puVar7[(long)(int)uVar13 + 1] + (puVar7[(int)uVar13] >> 4) + uVar13 + 6;
      pFVar5->nObjs = pFVar5->nObjs + 1;
      lVar16 = lVar16 + 1;
      pVVar8 = pGia->vCos;
    } while (lVar16 < pVVar8->nSize);
  }
  Gia_ManCleanMark0(pGia);
  if (iVar15 != pFVar5->nObjs - (p->nSize + p_00->nSize)) {
    __assert_fail("nNodes == Frc_ManNodeNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                  ,0x20f,"Frc_Man_t *Frc_ManStart(Gia_Man_t *)");
  }
  if ((int)local_38 != pFVar5->nObjs) {
    __assert_fail("nObjs == p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                  ,0x210,"Frc_Man_t *Frc_ManStart(Gia_Man_t *)");
  }
  if (uVar13 != uVar2) {
    __assert_fail("hHandle == p->nObjData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                  ,0x211,"Frc_Man_t *Frc_ManStart(Gia_Man_t *)");
  }
  uVar2 = pGia->nObjs;
  if ((0 < (int)uVar2) && (pGVar4 = pGia->pObjs, pGVar4 != (Gia_Obj_t *)0x0)) {
    lVar16 = 0;
    do {
      lVar14 = (long)*(int *)((long)&pGVar4->Value + lVar16);
      if (lVar14 != -1) {
        if (puVar7[lVar14] >> 4 != puVar7[lVar14 + 5]) {
          __assert_fail("pObjLog->nFanins == pObjLog->iFanin",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                        ,0x21a,"Frc_Man_t *Frc_ManStart(Gia_Man_t *)");
        }
        if (puVar7[lVar14 + 1] != puVar7[lVar14 + 2]) {
          __assert_fail("pObjLog->nFanouts == pObjLog->iFanout",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                        ,0x21b,"Frc_Man_t *Frc_ManStart(Gia_Man_t *)");
        }
        puVar7[lVar14 + 2] = 0;
        puVar7[lVar14 + 5] = 0;
      }
      lVar16 = lVar16 + 0xc;
    } while ((ulong)uVar2 * 0xc != lVar16);
  }
  if (pGia->pRefs != (int *)0x0) {
    free(pGia->pRefs);
    pGia->pRefs = (int *)0x0;
  }
  return pFVar5;
}

Assistant:

Frc_Man_t * Frc_ManStart( Gia_Man_t * pGia )
{
    Frc_Man_t * p;
    Frc_Obj_t * pObjLog, * pFanLog;
    Gia_Obj_t * pObj, * pFanin;//, * pObjRi, * pObjRo;
    Vec_Int_t * vSuper, * vVisit;
    int nObjs, nFanios, nNodes = 0;
    int i, k, hHandle = 0;
    // prepare the AIG
//    Gia_ManCreateRefs( pGia );
    Frc_ManCreateRefsSpecial( pGia );
    Frc_ManTransformRefs( pGia, &nObjs, &nFanios );
    Gia_ManFillValue( pGia );
    // create logic network
    p = ABC_CALLOC( Frc_Man_t, 1 );
    p->pGia  = pGia;
    p->nRegs = Gia_ManRegNum(pGia);
    p->vCis  = Vec_IntAlloc( Gia_ManCiNum(pGia) );
    p->vCos  = Vec_IntAlloc( Gia_ManCoNum(pGia) );
    p->nObjData = (sizeof(Frc_Obj_t) / 4) * nObjs + 2 * nFanios;
    p->pObjData = ABC_CALLOC( int, p->nObjData );
    // create constant node
    Gia_ManConst0(pGia)->Value = hHandle;
    pObjLog = Frc_ManObj( p, hHandle );
    pObjLog->hHandle  = hHandle;
    pObjLog->nFanins  = 0;
    pObjLog->nFanouts = Gia_ObjRefNum( pGia, Gia_ManConst0(pGia) );
    // count objects
    hHandle += Frc_ObjSize( pObjLog );
    nNodes++;
    p->nObjs++;
    // create the PIs
    Gia_ManForEachCi( pGia, pObj, i )
    {
        // create PI object
        pObj->Value = hHandle;
        Vec_IntPush( p->vCis, hHandle );
        pObjLog = Frc_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = 0;
        pObjLog->nFanouts = Gia_ObjRefNum( pGia, pObj );
        pObjLog->fCi = 1;
        // count objects
        hHandle += Frc_ObjSize( pObjLog );
        p->nObjs++;
    }
    // create internal nodes
    vSuper = Vec_IntAlloc( 100 );
    vVisit = Vec_IntAlloc( 100 );
    Gia_ManForEachAnd( pGia, pObj, i )
    {
        if ( pObj->fMark0 == 0 )
        {
            assert( Gia_ObjRefNum( pGia, pObj ) == 0 );
            continue;
        }
        assert( Gia_ObjRefNum( pGia, pObj ) > 0 );
        Frc_ManCollectSuper( pGia, pObj, vSuper, vVisit );
        // create node object
        pObj->Value = hHandle;
        pObjLog = Frc_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = Vec_IntSize( vSuper );
        pObjLog->nFanouts = Gia_ObjRefNum( pGia, pObj );
        // add fanins
        Gia_ManForEachObjVec( vSuper, pGia, pFanin, k )
        {
            pFanLog = Frc_ManObj( p, Gia_ObjValue(pFanin) ); 
            Frc_ObjAddFanin( pObjLog, pFanLog );
        }
        // count objects
        hHandle += Frc_ObjSize( pObjLog );
        nNodes++;
        p->nObjs++;
    }
    Vec_IntFree( vSuper );
    Vec_IntFree( vVisit );
    // create the POs
    Gia_ManForEachCo( pGia, pObj, i )
    {
        // create PO object
        pObj->Value = hHandle;
        Vec_IntPush( p->vCos, hHandle );
        pObjLog = Frc_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = 1;
        pObjLog->nFanouts = 0;
        pObjLog->fCo = 1;
        // add fanins
        pFanLog = Frc_ManObj( p, Gia_ObjValue(Gia_ObjFanin0(pObj)) );
        Frc_ObjAddFanin( pObjLog, pFanLog );
        // count objects
        hHandle += Frc_ObjSize( pObjLog );
        p->nObjs++;
    }
    // connect registers
//    Gia_ManForEachRiRo( pGia, pObjRi, pObjRo, i )
//        Frc_ObjAddFanin( Frc_ManObj(p,Gia_ObjValue(pObjRo)), Frc_ManObj(p,Gia_ObjValue(pObjRi)) );
    Gia_ManCleanMark0( pGia );
    assert( nNodes  == Frc_ManNodeNum(p) );
    assert( nObjs   == p->nObjs );
    assert( hHandle == p->nObjData );
    if ( hHandle != p->nObjData )
        printf( "Frc_ManStart(): Fatal error in internal representation.\n" );
    // make sure the fanin/fanout counters are correct
    Gia_ManForEachObj( pGia, pObj, i )
    {
        if ( !~Gia_ObjValue(pObj) )
            continue;
        pObjLog = Frc_ManObj( p, Gia_ObjValue(pObj) );
        assert( pObjLog->nFanins  == pObjLog->iFanin );
        assert( pObjLog->nFanouts == pObjLog->iFanout );
        pObjLog->iFanin = pObjLog->iFanout = 0;
    }
    ABC_FREE( pGia->pRefs );
    return p;
}